

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int evfilt_signal_knote_delete(filter *filt,knote *kn)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  int rv;
  int sigfd;
  int local_4;
  
  iVar1 = *(int *)(in_RSI + 0x80);
  if (*(int *)(in_RSI + 0x80) == -1) {
    local_4 = 0;
  }
  else {
    local_4 = epoll_ctl(*(int *)(*(long *)(in_RDI + 0x98) + 0x7c0),2,iVar1,(epoll_event *)0x0);
    iVar1 = close(iVar1);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      *(undefined4 *)(in_RSI + 0x80) = 0xffffffff;
    }
  }
  return local_4;
}

Assistant:

int
evfilt_signal_knote_delete(struct filter *filt, struct knote *kn)
{
    const int sigfd = kn->kn_signalfd;
    int       rv = 0;

    /* Needed so that delete() can be called after disable() */
    if (kn->kn_signalfd == -1)
        return (0);

    rv = epoll_ctl(filter_epoll_fd(filt), EPOLL_CTL_DEL, sigfd, NULL);
    if (rv < 0) {
        dbg_perror("epoll_ctl(2)");
    } else {
        dbg_printf("sig_fd=%i - removed from epoll_fd=%i", sigfd, filter_epoll_fd(filt));
    }

    dbg_printf("sig_fd=%d - closed", sigfd);
    if (close(sigfd) < 0) {
        dbg_perror("close(2)");
        return (-1);
    }

    /* NOTE: This does not call sigprocmask(3) to unblock the signal. */
    kn->kn_signalfd = -1;

    return (rv);
}